

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O1

Orphan<capnp::compiler::ParsedFile> * __thiscall
capnp::compiler::ModuleLoader::ModuleImpl::loadContent
          (Orphan<capnp::compiler::ParsedFile> *__return_storage_ptr__,ModuleImpl *this,
          Orphanage orphanage)

{
  ReadableFile *pRVar1;
  Disposer *pDVar2;
  LineBreakTable *pLVar3;
  Builder result;
  Reader statements_00;
  Builder result_00;
  ArrayPtr<const_char> content_00;
  ArrayPtr<const_char> input;
  SegmentBuilder *pSVar4;
  CapTableBuilder *pCVar5;
  Array<const_char> content;
  Builder statements;
  MallocMessageBuilder lexedBuilder;
  SegmentBuilder *local_208;
  CapTableBuilder *pCStack_200;
  undefined8 *local_1f8;
  StructBuilder local_1e8;
  PointerBuilder local_1c0;
  undefined1 local_1a8 [48];
  StructBuilder local_178;
  ListReader local_150;
  MallocMessageBuilder local_120;
  
  pRVar1 = (this->file).ptr;
  (*(pRVar1->super_FsNode)._vptr_FsNode[2])(&local_120,pRVar1);
  (*(pRVar1->super_FsNode)._vptr_FsNode[7])
            (&local_1e8,pRVar1,0,local_120.super_MessageBuilder.arenaSpace[0]);
  if ((undefined8 *)local_1e8.data == (undefined8 *)0x0) {
    local_208 = (SegmentBuilder *)0x0;
    pCStack_200 = (CapTableBuilder *)0x0;
    local_1f8 = (undefined8 *)0x0;
  }
  else {
    local_208 = local_1e8.segment;
    pCStack_200 = local_1e8.capTable;
    local_1f8 = (undefined8 *)local_1e8.data;
    local_1e8.segment = (SegmentBuilder *)0x0;
    local_1e8.capTable = (CapTableBuilder *)0x0;
  }
  pCVar5 = local_1e8.capTable;
  pSVar4 = local_1e8.segment;
  if (local_1e8.segment != (SegmentBuilder *)0x0) {
    local_1e8.segment = (SegmentBuilder *)0x0;
    local_1e8.capTable = (CapTableBuilder *)0x0;
    (*(code *)**local_1e8.data)(local_1e8.data,pSVar4,1,pCVar5,pCVar5,0);
  }
  pDVar2 = (this->lineBreaks).ptr.disposer;
  pLVar3 = (this->lineBreaks).ptr.ptr;
  (this->lineBreaks).ptr.disposer = (Disposer *)0x0;
  (this->lineBreaks).ptr.ptr = (LineBreakTable *)0x0;
  if (pLVar3 != (LineBreakTable *)0x0) {
    (**pDVar2->_vptr_Disposer)();
  }
  content_00.size_ = (size_t)pCStack_200;
  content_00.ptr = (char *)local_208;
  LineBreakTable::LineBreakTable((LineBreakTable *)&this->lineBreaksSpace,content_00);
  pDVar2 = (this->lineBreaks).ptr.disposer;
  pLVar3 = (this->lineBreaks).ptr.ptr;
  (this->lineBreaks).ptr.disposer =
       (Disposer *)&kj::DestructorOnlyDisposer<capnp::compiler::LineBreakTable>::instance;
  (this->lineBreaks).ptr.ptr = (LineBreakTable *)&this->lineBreaksSpace;
  if (pLVar3 != (LineBreakTable *)0x0) {
    (**pDVar2->_vptr_Disposer)();
  }
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1c0,&local_120.super_MessageBuilder);
  local_1a8._16_8_ = local_1c0.pointer;
  local_1a8._0_8_ = local_1c0.segment;
  local_1a8._8_8_ = local_1c0.capTable;
  capnp::_::PointerBuilder::initStruct(&local_1e8,(PointerBuilder *)local_1a8,(StructSize)0x10000);
  input.size_ = (size_t)pCStack_200;
  input.ptr = (char *)local_208;
  result._builder.capTable = local_1e8.capTable;
  result._builder.segment = local_1e8.segment;
  result._builder.data = local_1e8.data;
  result._builder.pointers = local_1e8.pointers;
  result._builder.dataSize = local_1e8.dataSize;
  result._builder.pointerCount = local_1e8.pointerCount;
  result._builder._38_2_ = local_1e8._38_2_;
  lex(input,result,(ErrorReporter *)this);
  capnp::_::OrphanBuilder::initStruct
            ((OrphanBuilder *)local_1a8,orphanage.arena,orphanage.capTable,(StructSize)0x10000);
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)local_1a8._8_8_;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)local_1a8._16_8_;
  (__return_storage_ptr__->builder).location = (word *)local_1a8._24_8_;
  (__return_storage_ptr__->builder).tag.content = local_1a8._0_8_;
  local_1c0.segment = local_1e8.segment;
  local_1c0.capTable = local_1e8.capTable;
  local_1c0.pointer = local_1e8.pointers;
  capnp::_::PointerBuilder::getStructList
            ((ListBuilder *)local_1a8,&local_1c0,(StructSize)0x30002,(word *)0x0);
  capnp::_::ListBuilder::asReader(&local_150,(ListBuilder *)local_1a8);
  capnp::_::OrphanBuilder::asStruct(&local_178,&__return_storage_ptr__->builder,(StructSize)0x10000)
  ;
  statements_00.reader.capTable = local_150.capTable;
  statements_00.reader.segment = local_150.segment;
  statements_00.reader.ptr = local_150.ptr;
  statements_00.reader.elementCount = local_150.elementCount;
  statements_00.reader.step = local_150.step;
  statements_00.reader.structDataSize = local_150.structDataSize;
  statements_00.reader.structPointerCount = local_150.structPointerCount;
  statements_00.reader.elementSize = local_150.elementSize;
  statements_00.reader._39_1_ = local_150._39_1_;
  statements_00.reader.nestingLimit = local_150.nestingLimit;
  statements_00.reader._44_4_ = local_150._44_4_;
  result_00._builder.capTable = local_178.capTable;
  result_00._builder.segment = local_178.segment;
  result_00._builder.data = local_178.data;
  result_00._builder.pointers = local_178.pointers;
  result_00._builder.dataSize = local_178.dataSize;
  result_00._builder.pointerCount = local_178.pointerCount;
  result_00._builder._38_2_ = local_178._38_2_;
  parseFile(statements_00,result_00,(ErrorReporter *)this,this->loader->fileIdsRequired);
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  if (local_208 != (SegmentBuilder *)0x0) {
    (**(code **)*local_1f8)(local_1f8,local_208,1,pCStack_200,pCStack_200,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<ParsedFile> loadContent(Orphanage orphanage) override {
    kj::Array<const char> content = file->mmap(0, file->stat().size).releaseAsChars();

    lineBreaks = kj::none;  // In case loadContent() is called multiple times.
    lineBreaks = lineBreaksSpace.construct(content);

    MallocMessageBuilder lexedBuilder;
    auto statements = lexedBuilder.initRoot<LexedStatements>();
    lex(content, statements, *this);

    auto parsed = orphanage.newOrphan<ParsedFile>();
    parseFile(statements.getStatements(), parsed.get(), *this, loader.areFileIdsRequired());
    return parsed;
  }